

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  uchar *puVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int itemsize;
  int itemsize_00;
  int iVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  ulong extraout_RDX_01;
  long lVar15;
  ulong uVar16;
  undefined4 in_register_00000034;
  ulong uVar17;
  int iVar18;
  void *__dest;
  uint local_b0;
  uint local_ac;
  uchar *local_a8;
  uint local_9c;
  ulong local_98;
  byte *local_90;
  void *local_88;
  ulong local_80;
  uchar *local_78;
  uchar *local_70;
  uchar *local_68;
  int local_60;
  int local_5c;
  ulong local_58;
  int *local_50;
  size_t local_48;
  ulong local_40;
  void **local_38;
  
  local_98 = CONCAT44(in_register_00000034,data_len);
  local_a8 = (uchar *)0x0;
  local_78 = data;
  local_50 = out_len;
  pvVar8 = malloc(0x20000);
  if (pvVar8 == (void *)0x0) {
    return (uchar *)0x0;
  }
  local_58 = 5;
  if (5 < quality) {
    local_58 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_a8,1,itemsize);
  iVar18 = *(int *)(local_a8 + -4);
  *(int *)(local_a8 + -4) = iVar18 + 1;
  local_a8[iVar18] = 'x';
  iVar11 = *(int *)(local_a8 + -4);
  iVar18 = iVar11 + 1;
  if (*(int *)(local_a8 + -8) <= iVar18) {
    stbiw__sbgrowf(&local_a8,1,itemsize_00);
    iVar11 = *(int *)(local_a8 + -4);
    iVar18 = iVar11 + 1;
  }
  *(int *)(local_a8 + -4) = iVar18;
  local_a8[iVar11] = '^';
  local_b0 = 1;
  local_ac = local_b0;
  puVar9 = stbiw__zlib_flushf(local_a8,&local_ac,(int *)&local_b0);
  local_ac = local_ac | 1 << ((byte)local_b0 & 0x1f);
  local_b0 = local_b0 + 2;
  puVar9 = stbiw__zlib_flushf(puVar9,&local_ac,(int *)&local_b0);
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    *(undefined8 *)((long)pvVar8 + lVar10 * 8) = 0;
  }
  local_5c = (int)local_98 + -3;
  local_60 = (int)local_58 * 2;
  local_40 = local_58 & 0xffffffff;
  local_48 = local_40 * 8;
  uVar16 = 0;
  local_a8 = puVar9;
  local_88 = pvVar8;
  while (iVar18 = (int)uVar16, iVar18 < local_5c) {
    local_90 = local_78 + iVar18;
    uVar5 = stbiw__zhash(local_90);
    __dest = *(void **)((long)pvVar8 + (ulong)(uVar5 & 0x3fff) * 8);
    if (__dest == (void *)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = (long)*(int *)((long)__dest + -4);
    }
    local_38 = (void **)((long)pvVar8 + (ulong)(uVar5 & 0x3fff) * 8);
    iVar11 = (int)local_98;
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    local_9c = 3;
    local_70 = (uchar *)0x0;
    uVar14 = extraout_RDX;
    local_80 = uVar16;
    local_68 = puVar9;
    for (lVar15 = 0; pbVar1 = local_90, iVar13 = (int)uVar14, lVar10 != lVar15; lVar15 = lVar15 + 1)
    {
      puVar9 = *(uchar **)((long)__dest + lVar15 * 8);
      if ((long)(iVar18 + -0x8000) < (long)puVar9 - (long)local_78) {
        uVar6 = stbiw__zlib_countm(puVar9,local_90,iVar11 - iVar18);
        uVar5 = local_9c;
        if ((int)local_9c < (int)uVar6) {
          uVar5 = uVar6;
        }
        bVar3 = (int)local_9c <= (int)uVar6;
        uVar14 = extraout_RDX_00;
        local_9c = uVar5;
        if (bVar3) {
          local_70 = puVar9;
        }
      }
    }
    if (__dest == (void *)0x0) {
LAB_00103de8:
      ppvVar4 = local_38;
      stbiw__sbgrowf(local_38,8,iVar13);
      __dest = *ppvVar4;
      iVar18 = *(int *)((long)__dest + -4);
      iVar11 = iVar18 + 1;
    }
    else {
      iVar18 = *(int *)((long)__dest + -4);
      if (iVar18 == local_60) {
        memmove(__dest,(void *)(local_40 * 8 + (long)__dest),local_48);
        iVar18 = (int)local_58;
        *(int *)((long)__dest + -4) = iVar18;
        iVar13 = extraout_EDX;
      }
      iVar11 = iVar18 + 1;
      if (*(int *)((long)__dest + -8) <= iVar11) goto LAB_00103de8;
    }
    *(int *)((long)__dest + -4) = iVar11;
    *(byte **)((long)__dest + (long)iVar18 * 8) = pbVar1;
    if (local_70 == (uchar *)0x0) {
LAB_00103e97:
      bVar2 = *local_90;
      if (bVar2 < 0x90) {
        iVar18 = stbiw__zlib_bitrev(bVar2 + 0x30,8);
        local_ac = local_ac | iVar18 << ((byte)local_b0 & 0x1f);
        local_b0 = local_b0 + 8;
      }
      else {
        iVar18 = stbiw__zlib_bitrev(bVar2 | 0x100,9);
        local_ac = local_ac | iVar18 << ((byte)local_b0 & 0x1f);
        local_b0 = local_b0 + 9;
      }
      local_9c = 1;
      puVar9 = local_68;
LAB_00104070:
      pvVar8 = local_88;
      iVar18 = (int)local_80;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_ac,(int *)&local_b0);
    }
    else {
      pbVar1 = local_90 + 1;
      uVar5 = stbiw__zhash(pbVar1);
      lVar10 = *(long *)((long)local_88 + (ulong)(uVar5 & 0x3fff) * 8);
      if (lVar10 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint *)(lVar10 + -4);
      }
      uVar6 = (uint)local_80;
      iVar18 = ~uVar6 + (int)local_98;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      for (uVar16 = 0; puVar9 = local_68, uVar5 != uVar16; uVar16 = uVar16 + 1) {
        puVar9 = *(uchar **)(lVar10 + uVar16 * 8);
        if (((long)(int)(uVar6 - 0x7fff) < (long)puVar9 - (long)local_78) &&
           (uVar7 = stbiw__zlib_countm(puVar9,pbVar1,iVar18), (int)local_9c < (int)uVar7))
        goto LAB_00103e97;
      }
      uVar5 = (int)local_90 - (int)local_70;
      if ((0x7fff < (int)uVar5) || (0x102 < (int)local_9c)) {
        __assert_fail("d <= 32767 && best <= 258",
                      "/workspace/llm4binary/github/license_c_cmakelists/dressupgeekout[P]lunapurpura/src/xpk/../lputil/stb_image_write.h"
                      ,0x3bf,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)");
      }
      uVar16 = 0;
      do {
        uVar17 = uVar16;
        uVar16 = uVar17 + 1;
      } while ((int)(uint)stbi_zlib_compress::lengthc[uVar17 + 1] <= (int)local_9c);
      iVar18 = (int)(uVar17 + 1);
      local_90 = (byte *)(ulong)uVar5;
      if (uVar17 < 0x17) {
        iVar18 = stbiw__zlib_bitrev(iVar18,7);
        local_ac = local_ac | iVar18 << ((byte)local_b0 & 0x1f);
        local_b0 = local_b0 + 7;
      }
      else {
        iVar18 = stbiw__zlib_bitrev(iVar18 + 0xa8,8);
        local_ac = local_ac | iVar18 << ((byte)local_b0 & 0x1f);
        local_b0 = local_b0 + 8;
      }
      puVar9 = stbiw__zlib_flushf(puVar9,&local_ac,(int *)&local_b0);
      uVar17 = uVar17 & 0xffffffff;
      if (0xffffffffffffffeb < uVar17 - 0x1c) {
        local_ac = local_ac |
                   local_9c - stbi_zlib_compress::lengthc[uVar17] << ((byte)local_b0 & 0x1f);
        local_b0 = ""[uVar17] + local_b0;
        puVar9 = stbiw__zlib_flushf(puVar9,&local_ac,(int *)&local_b0);
      }
      uVar16 = 0xffffffffffffffff;
      do {
        lVar10 = uVar16 + 2;
        uVar16 = uVar16 + 1;
        iVar18 = (int)local_90;
      } while ((int)(uint)stbi_zlib_compress::distc[lVar10] <= iVar18);
      iVar11 = stbiw__zlib_bitrev((int)uVar16,5);
      local_ac = local_ac | iVar11 << ((byte)local_b0 & 0x1f);
      local_b0 = local_b0 + 5;
      puVar9 = stbiw__zlib_flushf(puVar9,&local_ac,(int *)&local_b0);
      if (3 < uVar16) {
        local_ac = local_ac |
                   iVar18 - (uint)stbi_zlib_compress::distc[uVar16 & 0xffffffff] <<
                   ((byte)local_b0 & 0x1f);
        local_b0 = ""[uVar16 & 0xffffffff] + local_b0;
        goto LAB_00104070;
      }
      iVar18 = (int)local_80;
      pvVar8 = local_88;
    }
    uVar16 = (ulong)(local_9c + iVar18);
  }
  lVar10 = (long)(int)local_98;
  local_a8 = puVar9;
  for (lVar15 = (long)iVar18; lVar15 < lVar10; lVar15 = lVar15 + 1) {
    bVar2 = local_78[lVar15];
    if (bVar2 < 0x90) {
      iVar18 = stbiw__zlib_bitrev(bVar2 + 0x30,8);
      local_ac = local_ac | iVar18 << ((byte)local_b0 & 0x1f);
      local_b0 = local_b0 + 8;
    }
    else {
      iVar18 = stbiw__zlib_bitrev(bVar2 | 0x100,9);
      local_ac = local_ac | iVar18 << ((byte)local_b0 & 0x1f);
      local_b0 = local_b0 + 9;
    }
    puVar9 = stbiw__zlib_flushf(puVar9,&local_ac,(int *)&local_b0);
  }
  local_a8 = puVar9;
  iVar18 = stbiw__zlib_bitrev(0,7);
  local_ac = local_ac | iVar18 << ((byte)local_b0 & 0x1f);
  uVar5 = local_b0 + 7;
  do {
    local_b0 = uVar5;
    puVar9 = stbiw__zlib_flushf(puVar9,&local_ac,(int *)&local_b0);
    pvVar8 = local_88;
    uVar5 = local_b0 + 1;
  } while (local_b0 != 0);
  local_a8 = puVar9;
  for (lVar10 = 0; lVar10 != 0x4000; lVar10 = lVar10 + 1) {
    lVar15 = *(long *)((long)pvVar8 + lVar10 * 8);
    if (lVar15 != 0) {
      free((void *)(lVar15 + -8));
    }
  }
  free(pvVar8);
  iVar18 = (int)local_98 + 0x7ffe;
  uVar16 = (long)iVar18 % 0x7fff & 0xffffffff;
  if ((iVar18 / 0x7fff) * 5 + (int)local_98 + 2 < *(int *)(puVar9 + -4)) {
    puVar9[-4] = '\x02';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    iVar11 = 0;
    iVar18 = 2;
    while( true ) {
      iVar13 = (int)uVar16;
      uVar5 = (int)local_98 - iVar11;
      if (uVar5 == 0 || (int)local_98 < iVar11) break;
      uVar6 = 0x7fff;
      if ((int)uVar5 < 0x7fff) {
        uVar6 = uVar5;
      }
      iVar12 = iVar18 + 1;
      if (*(int *)(puVar9 + -8) <= iVar12) {
        stbiw__sbgrowf(&local_a8,1,iVar13);
        iVar18 = *(int *)(local_a8 + -4);
        iVar12 = iVar18 + 1;
        puVar9 = local_a8;
        iVar13 = extraout_EDX_00;
      }
      *(int *)(puVar9 + -4) = iVar12;
      puVar9[iVar18] = (int)uVar5 < 0x8000;
      if (*(int *)(puVar9 + -8) <= *(int *)(puVar9 + -4) + 1) {
        stbiw__sbgrowf(&local_a8,1,iVar13);
      }
      iVar18 = *(int *)(local_a8 + -4);
      *(int *)(local_a8 + -4) = iVar18 + 1;
      local_a8[iVar18] = (uchar)uVar6;
      iVar13 = *(int *)(local_a8 + -4);
      iVar18 = iVar13 + 1;
      if (*(int *)(local_a8 + -8) <= iVar18) {
        stbiw__sbgrowf(&local_a8,1,iVar18);
        iVar13 = *(int *)(local_a8 + -4);
        iVar18 = iVar13 + 1;
      }
      *(int *)(local_a8 + -4) = iVar18;
      local_a8[iVar13] = (uchar)(uVar6 >> 8);
      iVar13 = *(int *)(local_a8 + -4);
      iVar18 = iVar13 + 1;
      if (*(int *)(local_a8 + -8) <= iVar18) {
        stbiw__sbgrowf(&local_a8,1,iVar18);
        iVar13 = *(int *)(local_a8 + -4);
        iVar18 = iVar13 + 1;
      }
      *(int *)(local_a8 + -4) = iVar18;
      local_a8[iVar13] = (uchar)~uVar6;
      if (*(int *)(local_a8 + -8) <= *(int *)(local_a8 + -4) + 1) {
        stbiw__sbgrowf(&local_a8,1,iVar18);
      }
      puVar9 = local_a8;
      iVar18 = *(int *)(local_a8 + -4);
      *(int *)(local_a8 + -4) = iVar18 + 1;
      local_a8[iVar18] = (uchar)(~uVar6 >> 8);
      memcpy(local_a8 + *(int *)(local_a8 + -4),local_78 + iVar11,(long)(int)uVar6);
      iVar18 = *(int *)(puVar9 + -4) + uVar6;
      *(int *)(puVar9 + -4) = iVar18;
      iVar11 = iVar11 + uVar6;
      uVar16 = extraout_RDX_01;
    }
  }
  uVar17 = (long)((ulong)(uint)((int)local_98 >> 0x1f) << 0x20 | local_98 & 0xffffffff) % 0x15b0 &
           0xffffffff;
  uVar5 = 1;
  uVar6 = 0;
  uVar16 = uVar17;
  for (iVar18 = 0; iVar11 = (int)uVar16, iVar18 < (int)local_98; iVar18 = iVar18 + iVar11) {
    iVar11 = (int)uVar17;
    uVar16 = 0;
    if (0 < iVar11) {
      uVar16 = uVar17;
    }
    for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
      uVar5 = uVar5 + local_78[uVar17 + (long)iVar18];
      uVar6 = uVar6 + uVar5;
    }
    uVar5 = uVar5 % 0xfff1;
    uVar16 = (ulong)uVar6 % 0xfff1;
    uVar17 = 0x15b0;
    uVar6 = (uint)uVar16;
  }
  if (puVar9 != (uchar *)0x0) {
    iVar13 = *(int *)(puVar9 + -4);
    iVar18 = iVar13 + 1;
    if (iVar18 < *(int *)(puVar9 + -8)) goto LAB_001043a4;
  }
  stbiw__sbgrowf(&local_a8,1,iVar11);
  iVar13 = *(int *)(local_a8 + -4);
  iVar18 = iVar13 + 1;
  puVar9 = local_a8;
  iVar11 = extraout_EDX_01;
LAB_001043a4:
  *(int *)(puVar9 + -4) = iVar18;
  puVar9[iVar13] = (uchar)(uVar6 >> 8);
  if (*(int *)(puVar9 + -8) <= *(int *)(puVar9 + -4) + 1) {
    stbiw__sbgrowf(&local_a8,1,iVar11);
    iVar11 = extraout_EDX_02;
  }
  iVar18 = *(int *)(local_a8 + -4);
  *(int *)(local_a8 + -4) = iVar18 + 1;
  local_a8[iVar18] = (uchar)uVar6;
  iVar13 = *(int *)(local_a8 + -4);
  iVar18 = iVar13 + 1;
  if (*(int *)(local_a8 + -8) <= iVar18) {
    stbiw__sbgrowf(&local_a8,1,iVar11);
    iVar13 = *(int *)(local_a8 + -4);
    iVar18 = iVar13 + 1;
    iVar11 = extraout_EDX_03;
  }
  *(int *)(local_a8 + -4) = iVar18;
  local_a8[iVar13] = (uchar)(uVar5 >> 8);
  iVar13 = *(int *)(local_a8 + -4);
  iVar18 = iVar13 + 1;
  if (*(int *)(local_a8 + -8) <= iVar18) {
    stbiw__sbgrowf(&local_a8,1,iVar11);
    iVar13 = *(int *)(local_a8 + -4);
    iVar18 = iVar13 + 1;
  }
  *(int *)(local_a8 + -4) = iVar18;
  local_a8[iVar13] = (uchar)uVar5;
  iVar18 = *(int *)(local_a8 + -4);
  *local_50 = iVar18;
  puVar9 = (uchar *)memmove(local_a8 + -8,local_a8,(long)iVar18);
  return puVar9;
}

Assistant:

STBIWDEF unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
#ifdef STBIW_ZLIB_COMPRESS
   // user provided a zlib compress implementation, use that
   return STBIW_ZLIB_COMPRESS(data, data_len, out_len, quality);
#else // use builtin
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(unsigned char**));
   if (hash_table == NULL)
      return NULL;
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) { best=d; bestloc=hlist[j]; }
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   // store uncompressed instead if compression was worse
   if (stbiw__sbn(out) > data_len + 2 + ((data_len+32766)/32767)*5) {
      stbiw__sbn(out) = 2;  // truncate to DEFLATE 32K window and FLEVEL = 1
      for (j = 0; j < data_len;) {
         int blocklen = data_len - j;
         if (blocklen > 32767) blocklen = 32767;
         stbiw__sbpush(out, data_len - j == blocklen); // BFINAL = ?, BTYPE = 0 -- no compression
         stbiw__sbpush(out, STBIW_UCHAR(blocklen)); // LEN
         stbiw__sbpush(out, STBIW_UCHAR(blocklen >> 8));
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen)); // NLEN
         stbiw__sbpush(out, STBIW_UCHAR(~blocklen >> 8));
         memcpy(out+stbiw__sbn(out), data+j, blocklen);
         stbiw__sbn(out) += blocklen;
         j += blocklen;
      }
   }

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) { s1 += data[j+i]; s2 += s1; }
         s1 %= 65521; s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
#endif // STBIW_ZLIB_COMPRESS
}